

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_search.cc
# Opt level: O0

void run(vw *vw_obj)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  ostream *poVar2;
  reference pvVar3;
  size_t i;
  uint32_t ADJ;
  uint32_t VERB;
  uint32_t NOUN;
  uint32_t DET;
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  vector<wt,_std::allocator<wt>_> data;
  SequenceLabelerTask task;
  value_type *in_stack_fffffffffffffd48;
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  wt *in_stack_fffffffffffffd60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vw *in_stack_fffffffffffffd78;
  allocator *paVar4;
  SequenceLabelerTask *in_stack_fffffffffffffd80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_268;
  allocator local_259;
  string local_258 [79];
  allocator local_209;
  string local_208 [79];
  allocator local_1b9;
  string local_1b8 [79];
  allocator local_169;
  string local_168 [79];
  allocator local_119;
  string local_118 [95];
  allocator local_b9;
  string local_b8 [72];
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60 [4];
  
  SequenceLabelerTask::SequenceLabelerTask(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::vector<wt,_std::allocator<wt>_>::vector((vector<wt,_std::allocator<wt>_> *)0x119551);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11955e);
  local_64 = 1;
  local_68 = 2;
  local_6c = 3;
  local_70 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"the",&local_b9);
  wt::wt(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
         (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  std::vector<wt,_std::allocator<wt>_>::push_back
            ((vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
  ;
  wt::~wt((wt *)0x1195f9);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"monster",&local_119);
  wt::wt(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
         (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  std::vector<wt,_std::allocator<wt>_>::push_back
            ((vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
  ;
  wt::~wt((wt *)0x119682);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  paVar4 = &local_169;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"ate",paVar4);
  wt::wt(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
         (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  std::vector<wt,_std::allocator<wt>_>::push_back
            ((vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
  ;
  wt::~wt((wt *)0x11970b);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  paVar4 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"a",paVar4);
  wt::wt(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
         (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  std::vector<wt,_std::allocator<wt>_>::push_back
            ((vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
  ;
  wt::~wt((wt *)0x119794);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"big",&local_209);
  wt::wt(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
         (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  std::vector<wt,_std::allocator<wt>_>::push_back
            ((vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
  ;
  wt::~wt((wt *)0x11981d);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"sandwich",&local_259);
  wt::wt(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
         (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  std::vector<wt,_std::allocator<wt>_>::push_back
            ((vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48)
  ;
  wt::~wt((wt *)0x11989d);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::learn(in_stack_fffffffffffffd50,(vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd48,
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1198ce);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::learn(in_stack_fffffffffffffd50,(vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd48,
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1198ed);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::learn(in_stack_fffffffffffffd50,(vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd48,
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11990c);
  SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::predict(in_stack_fffffffffffffd50,(vector<wt,_std::allocator<wt>_> *)in_stack_fffffffffffffd48,
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11992b);
  std::operator<<((ostream *)&std::cerr,"output = [");
  local_268 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while( true ) {
    this = local_268;
    pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_60);
    if (pvVar1 <= this) break;
    poVar2 = std::operator<<((ostream *)&std::cerr," ");
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_60,(size_type)local_268);
    std::ostream::operator<<(poVar2,*pvVar3);
    local_268 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                ((long)&(local_268->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr," ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cerr,"should have printed: 1 2 3 1 4 2");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  std::vector<wt,_std::allocator<wt>_>::~vector((vector<wt,_std::allocator<wt>_> *)this);
  SequenceLabelerTask::~SequenceLabelerTask((SequenceLabelerTask *)0x119cd9);
  return;
}

Assistant:

void run(vw& vw_obj)
{ // we put this in its own scope so that its destructor on
  // SequenceLabelerTask gets called *before* VW::finish gets called;
  // otherwise we'll get a segfault :(. i'm not sure what to do about
  // this :(.
  SequenceLabelerTask task(vw_obj);
  vector<wt> data;
  vector<uint32_t> output;
  uint32_t DET = 1, NOUN = 2, VERB = 3, ADJ = 4;
  data.push_back( wt("the", DET) );
  data.push_back( wt("monster", NOUN) );
  data.push_back( wt("ate", VERB) );
  data.push_back( wt("a", DET) );
  data.push_back( wt("big", ADJ) );
  data.push_back( wt("sandwich", NOUN) );
  task.learn(data, output);
  task.learn(data, output);
  task.learn(data, output);
  task.predict(data, output);
  cerr << "output = [";
  for (size_t i=0; i<output.size(); i++) cerr << " " << output[i];
  cerr << " ]" << endl;
  cerr << "should have printed: 1 2 3 1 4 2" << endl;
}